

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# html_tree_renderer.cpp
# Opt level: O2

string * __thiscall
duckdb::CreateTreeRecursive_abi_cxx11_
          (string *__return_storage_ptr__,duckdb *this,RenderTree *root,idx_t x,idx_t y)

{
  pointer pCVar1;
  pointer pbVar2;
  RenderTreeNode *pRVar3;
  pointer ppVar4;
  pointer params;
  pointer pbVar5;
  pointer pCVar6;
  optional_ptr<duckdb::RenderTreeNode,_true> node;
  optional_ptr<duckdb::RenderTreeNode,_true> node_1;
  string content_format;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  items;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  splits;
  string content;
  string title;
  string grid_item_format;
  allocator local_229;
  pointer local_228;
  string local_220;
  optional_ptr<duckdb::RenderTreeNode,_true> local_200;
  string local_1f8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_1d8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_1b8;
  RenderTreeNode *local_198;
  RenderTree *local_190;
  idx_t local_188;
  RenderTree *local_180;
  pointer local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  undefined1 *local_150;
  undefined8 local_148;
  undefined1 local_140 [16];
  string local_130;
  string local_110;
  string local_f0 [32];
  string local_d0 [32];
  string local_b0;
  string local_90;
  string local_70;
  string local_50 [32];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  ::std::__cxx11::string::string
            (local_d0,
             "\n        <div class=\"tf-nc\">\n            <div class=\"title\">%s</div>%s\n        </div>\n    "
             ,(allocator *)&local_1f8);
  local_200 = RenderTree::GetNode((RenderTree *)this,(idx_t)root,x);
  if (local_200.ptr == (RenderTreeNode *)0x0) {
    ::std::__cxx11::string::string
              ((string *)&local_130,anon_var_dwarf_4b0ffdd + 9,(allocator *)&local_1f8);
  }
  else {
    pRVar3 = optional_ptr<duckdb::RenderTreeNode,_true>::operator->(&local_200);
    ::std::__cxx11::string::string(local_f0,(string *)pRVar3);
    local_190 = root;
    local_188 = x;
    local_180 = (RenderTree *)this;
    pRVar3 = optional_ptr<duckdb::RenderTreeNode,_true>::operator*(&local_200);
    ::std::__cxx11::string::string
              ((string *)&local_1f8,
               "\n            <div class=\"content\">\n%s\n            </div>\n    ",
               (allocator *)&local_220);
    local_1d8.
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_1d8.
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1d8.
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    params = (pRVar3->extra_text).map.
             super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             .
             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    ppVar4 = (pRVar3->extra_text).map.
             super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             .
             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_198 = pRVar3;
    local_178 = params;
    while (this = (duckdb *)local_180, x = local_188, root = local_190, ppVar4 != local_178) {
      local_228 = ppVar4;
      if ((ppVar4->second)._M_string_length != 0) {
        ::std::__cxx11::string::string
                  ((string *)&local_170,"                <div class=\"sub-title\">%s</div>",
                   (allocator *)&local_1b8);
        ::std::__cxx11::string::string((string *)&local_90,(string *)local_228);
        StringUtil::Format<std::__cxx11::string>
                  (&local_220,(StringUtil *)&local_170,&local_90,&params->first);
        ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_1d8,
                   &local_220);
        ::std::__cxx11::string::~string((string *)&local_220);
        ::std::__cxx11::string::~string((string *)&local_90);
        ::std::__cxx11::string::~string((string *)&local_170);
        ::std::__cxx11::string::string
                  ((string *)&local_220,anon_var_dwarf_4b0ff16 + 8,(allocator *)&local_110);
        StringUtil::Split(&local_1b8,&local_228->second,&local_220);
        ::std::__cxx11::string::~string((string *)&local_220);
        pbVar2 = local_1b8.
                 super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 .
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        for (pbVar5 = local_1b8.
                      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start; pbVar5 != pbVar2;
            pbVar5 = pbVar5 + 1) {
          ::std::__cxx11::string::string
                    (local_50,"                <div class=\"value\">%s</div>",
                     (allocator *)&local_110);
          ::std::__cxx11::string::string((string *)&local_70,(string *)pbVar5);
          StringUtil::Format<std::__cxx11::string>
                    (&local_220,(StringUtil *)local_50,&local_70,&params->first);
          ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_1d8
                     ,&local_220);
          ::std::__cxx11::string::~string((string *)&local_220);
          ::std::__cxx11::string::~string((string *)&local_70);
          ::std::__cxx11::string::~string(local_50);
        }
        ::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_1b8);
      }
      ppVar4 = local_228 + 1;
    }
    local_150 = local_140;
    local_148 = 0;
    local_140[0] = 0;
    if (local_1d8.
        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_1d8.
        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      ::std::__cxx11::string::string((string *)&local_1b8,(string *)&local_1f8);
      ::std::__cxx11::string::string((string *)&local_b0,anon_var_dwarf_4b0ff16 + 8,&local_229);
      StringUtil::Join(&local_110,&local_1d8,&local_b0);
      StringUtil::Format<std::__cxx11::string>
                (&local_220,(StringUtil *)&local_1b8,&local_110,&params->first);
      ::std::__cxx11::string::operator=((string *)&local_150,(string *)&local_220);
      ::std::__cxx11::string::~string((string *)&local_220);
      ::std::__cxx11::string::~string((string *)&local_110);
      ::std::__cxx11::string::~string((string *)&local_b0);
      ::std::__cxx11::string::~string((string *)&local_1b8);
    }
    if ((local_198->child_positions).
        super_vector<duckdb::RenderTreeNode::Coordinate,_std::allocator<duckdb::RenderTreeNode::Coordinate>_>
        .
        super__Vector_base<duckdb::RenderTreeNode::Coordinate,_std::allocator<duckdb::RenderTreeNode::Coordinate>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        (local_198->child_positions).
        super_vector<duckdb::RenderTreeNode::Coordinate,_std::allocator<duckdb::RenderTreeNode::Coordinate>_>
        .
        super__Vector_base<duckdb::RenderTreeNode::Coordinate,_std::allocator<duckdb::RenderTreeNode::Coordinate>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      ::std::__cxx11::string::append((char *)&local_150);
    }
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_1d8);
    ::std::__cxx11::string::~string((string *)&local_1f8);
    ::std::__cxx11::string::string((string *)&local_1f8,local_d0);
    ::std::__cxx11::string::string((string *)&local_220,local_f0);
    ::std::__cxx11::string::string((string *)&local_170,(string *)&local_150);
    StringUtil::Format<std::__cxx11::string,std::__cxx11::string>
              (&local_130,(StringUtil *)&local_1f8,&local_220,&local_170,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)y);
    ::std::__cxx11::string::~string((string *)&local_170);
    ::std::__cxx11::string::~string((string *)&local_220);
    ::std::__cxx11::string::~string((string *)&local_1f8);
    ::std::__cxx11::string::~string((string *)&local_150);
    ::std::__cxx11::string::~string(local_f0);
  }
  ::std::__cxx11::string::~string(local_d0);
  ::std::__cxx11::string::append((string *)__return_storage_ptr__);
  ::std::__cxx11::string::~string((string *)&local_130);
  local_220._M_dataplus._M_p = (pointer)RenderTree::GetNode((RenderTree *)this,(idx_t)root,x);
  pRVar3 = optional_ptr<duckdb::RenderTreeNode,_true>::operator->
                     ((optional_ptr<duckdb::RenderTreeNode,_true> *)&local_220);
  if ((pRVar3->child_positions).
      super_vector<duckdb::RenderTreeNode::Coordinate,_std::allocator<duckdb::RenderTreeNode::Coordinate>_>
      .
      super__Vector_base<duckdb::RenderTreeNode::Coordinate,_std::allocator<duckdb::RenderTreeNode::Coordinate>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (pRVar3->child_positions).
      super_vector<duckdb::RenderTreeNode::Coordinate,_std::allocator<duckdb::RenderTreeNode::Coordinate>_>
      .
      super__Vector_base<duckdb::RenderTreeNode::Coordinate,_std::allocator<duckdb::RenderTreeNode::Coordinate>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    pRVar3 = optional_ptr<duckdb::RenderTreeNode,_true>::operator->
                       ((optional_ptr<duckdb::RenderTreeNode,_true> *)&local_220);
    pCVar1 = (pRVar3->child_positions).
             super_vector<duckdb::RenderTreeNode::Coordinate,_std::allocator<duckdb::RenderTreeNode::Coordinate>_>
             .
             super__Vector_base<duckdb::RenderTreeNode::Coordinate,_std::allocator<duckdb::RenderTreeNode::Coordinate>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pCVar6 = (pRVar3->child_positions).
                  super_vector<duckdb::RenderTreeNode::Coordinate,_std::allocator<duckdb::RenderTreeNode::Coordinate>_>
                  .
                  super__Vector_base<duckdb::RenderTreeNode::Coordinate,_std::allocator<duckdb::RenderTreeNode::Coordinate>_>
                  ._M_impl.super__Vector_impl_data._M_start; pCVar6 != pCVar1; pCVar6 = pCVar6 + 1)
    {
      CreateTreeRecursive_abi_cxx11_(&local_1f8,this,(RenderTree *)pCVar6->x,pCVar6->y,y);
      ::std::__cxx11::string::append((string *)__return_storage_ptr__);
      ::std::__cxx11::string::~string((string *)&local_1f8);
    }
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

static string CreateTreeRecursive(RenderTree &root, idx_t x, idx_t y) {
	string result;

	result += "<li>";
	result += CreateGridItem(root, x, y);
	auto node = root.GetNode(x, y);
	if (!node->child_positions.empty()) {
		result += "<ul class=\"list-inline\">";
		for (auto &coord : node->child_positions) {
			result += CreateTreeRecursive(root, coord.x, coord.y);
		}
		result += "</ul>";
	}
	result += "</li>";
	return result;
}